

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O0

pair<bool,_double> __thiscall mp::Violation::Check(Violation *this,double epsabs,double epsrel)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar1;
  double *in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  pair<bool,_double> pVar2;
  double violRel;
  double local_40;
  bool local_32;
  bool local_31;
  double local_30 [4];
  pair<bool,_double> local_10;
  
  local_30[0] = 0.0;
  if ((*in_RDI <= in_XMM0_Qa) ||
     (((in_RDI[1] != 0.0 || (NAN(in_RDI[1]))) &&
      (local_30[0] = ABS(*in_RDI / in_RDI[1]),
      local_30[0] <= (double)CONCAT44(in_XMM1_Db,in_XMM1_Da))))) {
    local_32 = false;
    local_40 = 0.0;
    std::pair<bool,_double>::pair<bool,_double,_true>(&local_10,&local_32,&local_40);
    uVar1 = extraout_RAX_00;
  }
  else {
    local_31 = true;
    std::pair<bool,_double>::pair<bool,_double_&,_true>(&local_10,&local_31,local_30);
    uVar1 = extraout_RAX;
  }
  pVar2._1_7_ = (undefined7)((ulong)uVar1 >> 8);
  pVar2.first = local_10.first;
  pVar2.second = local_10.second;
  return pVar2;
}

Assistant:

std::pair<bool, double> Check(
      double epsabs, double epsrel) const {
    double violRel {0.0};
    if (viol_ > epsabs
        && (!valX_
            || (violRel=std::fabs(viol_/valX_))>epsrel))
      return {true, violRel};
    return {false, 0.0};
  }